

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv.c
# Opt level: O3

void wake_waiters(nsync_dll_list_ to_wake_list,int all_readers)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  uint *puVar5;
  lock_type *plVar6;
  nsync_dll_element_ *pnVar7;
  nsync_dll_element_ *pnVar8;
  nsync_dll_list_ pnVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  pnVar7 = nsync_dll_first_(to_wake_list);
  pvVar4 = pnVar7->container;
  if (((*(byte *)((long)pvVar4 + 0x30) & 1) == 0) ||
     (puVar5 = *(uint **)((long)pvVar4 + 0x38), puVar5 == (uint *)0x0)) goto LAB_0010594c;
  uVar2 = *puVar5;
  uVar3 = **(uint **)((long)pvVar4 + 0x40);
  pnVar8 = nsync_dll_next_(to_wake_list,pnVar7);
  if ((char)((uVar2 & 2) >> 1) != '\0' || (uVar2 & 0xffffff01) == 0) goto LAB_0010594c;
  if ((uVar3 & uVar2) == 0) {
    if (all_readers != 0 || pnVar8 == (nsync_dll_element_ *)0x0) goto LAB_0010594c;
    LOCK();
    uVar3 = *puVar5;
    if (uVar2 == uVar3) {
      *puVar5 = uVar2 & 0xffffff79 | 6;
    }
    UNLOCK();
    if (uVar2 != uVar3) goto LAB_0010594c;
    bVar12 = *(lock_type **)((long)pvVar4 + 0x40) == nsync_writer_type_;
    bVar10 = !bVar12;
    bVar11 = false;
LAB_0010588c:
    do {
      pvVar4 = pnVar8->container;
      bVar1 = *(byte *)((long)pvVar4 + 0x30);
      pnVar7 = nsync_dll_next_(to_wake_list,pnVar8);
      if ((bVar1 & 1) != 0) {
        plVar6 = *(lock_type **)((long)pnVar8->container + 0x40);
        if ((bool)(plVar6 == nsync_writer_type_ | bVar12)) {
          bVar13 = plVar6 == nsync_writer_type_;
          to_wake_list = nsync_dll_remove_(to_wake_list,pnVar8);
          pnVar9 = nsync_dll_make_last_in_list_(*(nsync_dll_list_ *)(puVar5 + 2),pnVar8);
          *(nsync_dll_list_ *)(puVar5 + 2) = pnVar9;
          *(undefined8 *)((long)pvVar4 + 0x38) = 0;
          bVar11 = bVar11 || bVar13;
        }
        else {
          bVar10 = true;
        }
      }
      pnVar8 = pnVar7;
    } while (pnVar7 != (nsync_dll_element_ *)0x0);
  }
  else {
    LOCK();
    uVar3 = *puVar5;
    if (uVar2 == uVar3) {
      *puVar5 = uVar2 & 0xffffff79 | 6;
    }
    UNLOCK();
    if (uVar2 != uVar3) goto LAB_0010594c;
    bVar11 = *(lock_type **)((long)pvVar4 + 0x40) == nsync_writer_type_;
    to_wake_list = nsync_dll_remove_(to_wake_list,pnVar7);
    pnVar9 = nsync_dll_make_last_in_list_(*(nsync_dll_list_ *)(puVar5 + 2),pnVar7);
    *(nsync_dll_list_ *)(puVar5 + 2) = pnVar9;
    *(undefined8 *)((long)pvVar4 + 0x38) = 0;
    bVar12 = true;
    bVar10 = false;
    if (pnVar8 != (nsync_dll_element_ *)0x0) {
      bVar10 = false;
      goto LAB_0010588c;
    }
  }
  do {
    uVar3 = *puVar5;
    LOCK();
    uVar2 = *puVar5;
    if (uVar3 == uVar2) {
      *puVar5 = uVar3 & 0xfffffffd | (uint)((bVar10 ^ 1U) & bVar11) << 5;
    }
    UNLOCK();
  } while (uVar3 != uVar2);
LAB_0010594c:
  pnVar7 = nsync_dll_first_(to_wake_list);
  while (pnVar7 != (nsync_dll_element_ *)0x0) {
    pvVar4 = pnVar7->container;
    pnVar8 = nsync_dll_next_(to_wake_list,pnVar7);
    to_wake_list = nsync_dll_remove_(to_wake_list,pnVar7);
    *(undefined4 *)((long)pvVar4 + 0x20) = 0;
    nsync_mu_semaphore_v(*(nsync_semaphore **)((long)pvVar4 + 0x28));
    pnVar7 = pnVar8;
  }
  return;
}

Assistant:

static void wake_waiters (nsync_dll_list_ to_wake_list, int all_readers) {
	nsync_dll_element_ *p = NULL;
	nsync_dll_element_ *next = NULL;
	nsync_dll_element_ *first_waiter = nsync_dll_first_ (to_wake_list);
	struct nsync_waiter_s *first_nw = DLL_NSYNC_WAITER (first_waiter);
	waiter *first_w = NULL;
	nsync_mu *pmu = NULL;
	if ((first_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0) {
		first_w = DLL_WAITER (first_waiter);
		pmu = first_w->cv_mu;
	}
	if (pmu != NULL) { /* waiter is associated with the nsync_mu *pmu. */
		/* We will transfer elements of to_wake_list to *pmu if all of:
		    - some thread holds the lock, and
		    - *pmu's spinlock is not held, and
		    - either *pmu cannot be acquired in the mode of the first
		      waiter, or there's more than one thread on to_wake_list
		      and not all are readers, and
		    - we acquire the spinlock on the first try.
		   The spinlock acquisition also marks *pmu as having waiters.
		   The requirement that some thread holds the lock ensures
		   that at least one of the transferred waiters will be woken.
		   */
		uint32_t old_mu_word = ATM_LOAD (&pmu->word);
		int first_cant_acquire = ((old_mu_word & first_w->l_type->zero_to_acquire) != 0);
		next = nsync_dll_next_ (to_wake_list, first_waiter);
		if ((old_mu_word&MU_ANY_LOCK) != 0 &&
		    (old_mu_word&MU_SPINLOCK) == 0 &&
		    (first_cant_acquire || (next != NULL && !all_readers)) &&
		    ATM_CAS_ACQ (&pmu->word, old_mu_word,
				 (old_mu_word|MU_SPINLOCK|MU_WAITING) &
				 ~MU_ALL_FALSE)) {

			uint32_t set_on_release = 0;

			/* For any waiter that should be transferred, rather
			   than woken, move it from to_wake_list to pmu->waiters. */
			int first_is_writer = first_w->l_type == nsync_writer_type_;
			int transferred_a_writer = 0;
			int woke_areader = 0;
			/* Transfer the first waiter iff it can't acquire *pmu. */
			if (first_cant_acquire) {
				to_wake_list = nsync_dll_remove_ (to_wake_list, first_waiter);
				pmu->waiters = nsync_dll_make_last_in_list_ (pmu->waiters, first_waiter);
				/* tell nsync_cv_wait_with_deadline() that we
				   moved the waiter to *pmu's queue.  */
				first_w->cv_mu = NULL;
				/* first_nw.waiting is already 1, from being on
				   cv's waiter queue.  */
				transferred_a_writer = first_is_writer;
			} else {
				woke_areader = !first_is_writer;
			}
			/* Now process the other waiters. */
			for (p = next; p != NULL; p = next) {
				int p_is_writer;
				struct nsync_waiter_s *p_nw = DLL_NSYNC_WAITER (p);
				waiter *p_w = NULL;
				if ((p_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0) {
					p_w = DLL_WAITER (p);
				}
				next = nsync_dll_next_ (to_wake_list, p);
				p_is_writer = (p_w != NULL &&
					       DLL_WAITER (p)->l_type == nsync_writer_type_);
				/* We transfer this element if any of:
				   - the first waiter can't acquire *pmu, or
				   - the first waiter is a writer, or
				   - this element is a writer. */
				if (p_w == NULL) {
					/* wake non-native waiter */
				} else if (first_cant_acquire || first_is_writer || p_is_writer) {
					to_wake_list = nsync_dll_remove_ (to_wake_list, p);
					pmu->waiters = nsync_dll_make_last_in_list_ (pmu->waiters, p);
					/* tell nsync_cv_wait_with_deadline()
					   that we moved the waiter to *pmu's
					   queue.  */
					p_w->cv_mu = NULL;
					/* p_nw->waiting is already 1, from
					   being on cv's waiter queue.  */
					transferred_a_writer = transferred_a_writer || p_is_writer;
				} else {
					woke_areader = woke_areader || !p_is_writer;
				}
			}

			/* Claim a waiting writer if we transferred one, except if we woke readers,
			   in which case we want those readers to be able to acquire immediately. */
			if (transferred_a_writer && !woke_areader) {
				set_on_release |= MU_WRITER_WAITING;
			}

			/* release *pmu's spinlock  (MU_WAITING was set by CAS above) */
			old_mu_word = ATM_LOAD (&pmu->word);
			while (!ATM_CAS_REL (&pmu->word, old_mu_word,
					     (old_mu_word|set_on_release) & ~MU_SPINLOCK)) {
				old_mu_word = ATM_LOAD (&pmu->word);
			}
		}
	}

	/* Wake any waiters we didn't manage to enqueue on the mu. */
	for (p = nsync_dll_first_ (to_wake_list); p != NULL; p = next) {
		struct nsync_waiter_s *p_nw = DLL_NSYNC_WAITER (p);
		next = nsync_dll_next_ (to_wake_list, p);
		to_wake_list = nsync_dll_remove_ (to_wake_list, p);
		/* Wake the waiter. */
		ATM_STORE_REL (&p_nw->waiting, 0); /* release store */
		nsync_mu_semaphore_v (p_nw->sem);
	}
}